

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O2

bool llvm::sys::path::has_extension(Twine *path,Style style)

{
  Style style_00;
  StringRef SVar1;
  StringRef SVar2;
  undefined1 local_a0 [8];
  SmallString<128U> path_storage;
  
  local_a0 = (undefined1  [8])
             &path_storage.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
              super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
              super_SmallVectorBase.Size;
  style_00 = windows;
  path_storage.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX = (void *)0x8000000000;
  SVar1 = Twine::toStringRef(path,(SmallVectorImpl<char> *)local_a0);
  SVar2.Length._0_4_ = style;
  SVar2.Data = (char *)SVar1.Length;
  SVar2.Length._4_4_ = 0;
  SVar2 = extension((path *)SVar1.Data,SVar2,style_00);
  SmallVectorImpl<char>::~SmallVectorImpl((SmallVectorImpl<char> *)local_a0);
  return SVar2.Length != 0;
}

Assistant:

bool has_extension(const Twine &path, Style style) {
  SmallString<128> path_storage;
  StringRef p = path.toStringRef(path_storage);

  return !extension(p, style).empty();
}